

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haar.c
# Opt level: O2

void horizontalHaar(uint8_t *_src,uint8_t *_dst,int rows,int cols)

{
  short sVar1;
  short sVar2;
  undefined1 auVar3 [32];
  long lVar4;
  undefined1 auVar5 [32];
  short sVar6;
  undefined2 uVar7;
  long lVar8;
  undefined1 (*pauVar9) [32];
  ulong uVar10;
  long lVar11;
  undefined1 (*pauVar12) [32];
  size_t col_1;
  ulong uVar13;
  uint8_t *puVar14;
  uint8_t *puVar15;
  ulong uVar16;
  undefined1 auVar17 [32];
  undefined1 in_ZMM2 [64];
  
  auVar5 = _DAT_0010c5c0;
  uVar16 = (ulong)(cols + -1);
  lVar4 = (long)cols * 2;
  puVar14 = _dst + (long)(cols / 2) * 2;
  puVar15 = _src + 2;
  pauVar12 = (undefined1 (*) [32])_dst;
  for (lVar11 = 0; lVar11 != rows; lVar11 = lVar11 + 1) {
    lVar8 = lVar11 * cols;
    pauVar9 = pauVar12;
    for (uVar10 = 0; uVar13 = (long)(int)(cols & 0xffffffe0),
        (long)(int)(cols & 0xffffffe0) != uVar10; uVar10 = uVar10 + 0x20) {
      auVar3 = vphsubw_avx2(in_ZMM2._0_32_,
                            *(undefined1 (*) [32])(_src + uVar10 * 2 + lVar8 * 2 + 0x20),
                            *(undefined1 (*) [32])(_src + uVar10 * 2 + lVar8 * 2));
      auVar17 = vphaddw_avx2(*(undefined1 (*) [32])(_src + uVar10 * 2 + lVar8 * 2 + 0x20),
                             *(undefined1 (*) [32])(_src + uVar10 * 2 + lVar8 * 2));
      auVar17 = vpsraw_avx2(auVar17,1);
      auVar17 = vpermd_avx2(auVar5,auVar17);
      auVar3 = vpermd_avx2(auVar5,auVar3);
      in_ZMM2 = ZEXT3264(auVar3);
      *pauVar9 = auVar17;
      *(undefined1 (*) [32])(*pauVar9 + (long)(cols / 2) * 2) = auVar3;
      pauVar9 = pauVar9 + 1;
    }
    for (; uVar13 < uVar16; uVar13 = uVar13 + 2) {
      sVar1 = *(short *)(puVar15 + uVar13 * 2);
      sVar2 = *(short *)(puVar15 + uVar13 * 2 + -2);
      sVar6 = sVar2 + sVar1;
      if (sVar6 < 0) {
        uVar7 = (undefined2)((int)((int)sVar6 - 1U) / 2);
      }
      else {
        uVar7 = (undefined2)((uint)(int)sVar6 >> 1);
      }
      *(undefined2 *)(*pauVar12 + uVar13) = uVar7;
      *(short *)(puVar14 + uVar13) = sVar2 - sVar1;
    }
    if ((cols & 1U) != 0) {
      *(undefined2 *)(_dst + uVar16 * 2 + lVar8 * 2) =
           *(undefined2 *)(_src + uVar16 * 2 + lVar8 * 2);
    }
    pauVar12 = (undefined1 (*) [32])(*pauVar12 + lVar4);
    puVar14 = puVar14 + lVar4;
    puVar15 = puVar15 + lVar4;
  }
  return;
}

Assistant:

void horizontalHaar(const uint8_t* IMAGESTEGO_RESTRICT _src, uint8_t* IMAGESTEGO_RESTRICT _dst, const int rows,
        const int cols) {
    __m256i mask = _mm256_set_epi32(5, 4, 1, 0, 7, 6, 3, 2);
    const int16_t* src = (const int16_t*) _src;
    int16_t* dst = (int16_t*) _dst;
    for (size_t row = 0; row < rows; ++row) {
        const int16_t* sptr = src + row * cols;
        int16_t* dptr = dst + row * cols;
        const int aligned = align32(cols);
        for (size_t col = 0; col != aligned; col += 32) {
            int16_t* tmp1 = dptr + col / 2, * tmp2 = tmp1 + cols / 2;
#if IMAGESTEGO_GCC || IMAGESTEGO_CLANG || IMAGESTEGO_ICC
            asm(
                "vmovdqu (%[src], %[col], 2), %%ymm0  \n\t"
                "vmovdqu 32(%[src], %[col], 2), %%ymm1\n\t"
                "vphsubw %%ymm0, %%ymm1, %%ymm2       \n\t"
                "vphaddw %%ymm0, %%ymm1, %%ymm1       \n\t"
                "vpsraw  $0x1, %%ymm1, %%ymm1         \n\t"
                "vpermd  %%ymm1, %[mask], %%ymm1      \n\t"
                "vpermd  %%ymm2, %[mask], %%ymm2      \n\t"
                "vmovdqu %%ymm1, (%[lo])              \n\t"
                "vmovdqu %%ymm2, (%[hi])              \n\t"
                :
                : [lo]   "r" (tmp1),
                  [hi]   "r" (tmp2),
                  [src]  "r" (sptr),
                  [mask] "x" (mask),
                  [col]  "r" ((ptrdiff_t) col)
                : "%ymm0", "%ymm1", "%ymm2", "memory"
            );
#else // MSVC doesn't support inline asm for x64
            const __m256i a = _mm256_loadu_si256((const __m256i*) (src + col)),
                          b = _mm256_loadu_si256((const __m256i*) (src + col + 16));
            const __m256i lo = _mm256_srai_epi16(_mm256_hadd_epi16(b, a), 1),
                          hi = _mm256_hsub_epi16(b, a);
            _mm256_storeu_si256((__m256i*) tmp1, _mm256_permutevar8x32_epi32(lo, mask));
            _mm256_storeu_si256((__m256i*) tmp2, _mm256_permutevar8x32_epi32(hi, mask));
#endif
        }
        // TODO: implement with AVX512 if possible
        for (size_t col = aligned; col < cols - 1; col += 2) {
            *(dptr + col / 2) = floor2(sptr[col + 1] + sptr[col]);
            *(dptr + cols / 2 + col / 2) = sptr[col] - sptr[col + 1];
        }
        if (cols % 2 != 0) {
            dptr[cols - 1] = sptr[cols - 1];
        }
    }
}